

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

uint __thiscall llvm::cl::generic_parser_base::findOption(generic_parser_base *this,StringRef Name)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t __n;
  size_t extraout_RDX;
  uint uVar3;
  
  __n = Name.Length;
  uVar1 = (*this->_vptr_generic_parser_base[2])();
  if (uVar1 == 0) {
    uVar1 = 0;
  }
  else {
    uVar3 = 0;
    do {
      iVar2 = (*this->_vptr_generic_parser_base[3])(this,(ulong)uVar3);
      if (extraout_RDX == __n) {
        if (__n == 0) {
          return uVar3;
        }
        iVar2 = bcmp((void *)CONCAT44(extraout_var,iVar2),Name.Data,__n);
        if (iVar2 == 0) {
          return uVar3;
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return uVar1;
}

Assistant:

unsigned generic_parser_base::findOption(StringRef Name) {
  unsigned e = getNumOptions();

  for (unsigned i = 0; i != e; ++i) {
    if (getOption(i) == Name)
      return i;
  }
  return e;
}